

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currpinf.cpp
# Opt level: O3

void __thiscall icu_63::CurrencyPluralInfo::~CurrencyPluralInfo(CurrencyPluralInfo *this)

{
  void *in_RSI;
  
  ~CurrencyPluralInfo(this);
  UMemory::operator_delete((UMemory *)this,in_RSI);
  return;
}

Assistant:

CurrencyPluralInfo::~CurrencyPluralInfo() {
    deleteHash(fPluralCountToCurrencyUnitPattern);
    fPluralCountToCurrencyUnitPattern = nullptr;
    delete fPluralRules;
    delete fLocale;
    fPluralRules = nullptr;
    fLocale = nullptr;
}